

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav__on_seek(drwav_seek_proc onSeek,void *pUserData,int offset,drwav_seek_origin origin,
              drwav_uint64 *pCursor)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long *in_R8;
  drwav_bool32 local_4;
  
  if (in_RDI == (code *)0x0) {
    __assert_fail("onSeek != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                  ,0x60c,
                  "drwav_bool32 drwav__on_seek(drwav_seek_proc, void *, int, drwav_seek_origin, drwav_uint64 *)"
                 );
  }
  if (in_R8 != (long *)0x0) {
    iVar1 = (*in_RDI)(in_RSI,in_EDX,in_ECX);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if (in_ECX == 0) {
        *in_R8 = (long)in_EDX;
      }
      else {
        *in_R8 = (long)in_EDX + *in_R8;
      }
      local_4 = 1;
    }
    return local_4;
  }
  __assert_fail("pCursor != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/khang06[P]dsiflipencode/include/dr_wav.h"
                ,0x60d,
                "drwav_bool32 drwav__on_seek(drwav_seek_proc, void *, int, drwav_seek_origin, drwav_uint64 *)"
               );
}

Assistant:

drwav_bool32 drwav__on_seek(drwav_seek_proc onSeek, void* pUserData, int offset, drwav_seek_origin origin, drwav_uint64* pCursor)
{
    drwav_assert(onSeek != NULL);
    drwav_assert(pCursor != NULL);

    if (!onSeek(pUserData, offset, origin)) {
        return DRWAV_FALSE;
    }

    if (origin == drwav_seek_origin_start) {
        *pCursor = offset;
    } else {
        *pCursor += offset;
    }

    return DRWAV_TRUE;
}